

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-c.cpp
# Opt level: O3

duckdb_data_chunk duckdb_fetch_chunk(duckdb_result result)

{
  duckdb_data_chunk in_RAX;
  type pQVar1;
  duckdb_data_chunk local_8;
  
  if ((result.deprecated_error_message == (char *)0x0) ||
     (result.deprecated_error_message[8] == '\x03')) {
    local_8 = (duckdb_data_chunk)0x0;
  }
  else {
    result.deprecated_error_message[8] = '\x02';
    local_8 = in_RAX;
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)result.deprecated_error_message);
    (*(pQVar1->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&local_8,pQVar1);
  }
  return local_8;
}

Assistant:

duckdb_data_chunk duckdb_fetch_chunk(duckdb_result result) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *((duckdb::DuckDBResultData *)result.internal_data);
	if (result_data.result_set_type == duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_DEPRECATED) {
		return nullptr;
	}
	result_data.result_set_type = duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_STREAMING;
	auto &result_instance = (duckdb::QueryResult &)*result_data.result;
	// FetchRaw ? Do we care about flattening them?
	try {
		auto chunk = result_instance.Fetch();
		return reinterpret_cast<duckdb_data_chunk>(chunk.release());
	} catch (std::exception &e) {
		return nullptr;
	}
}